

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::
ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture> *this,char *name,
          CodeLocation *code_location)

{
  CodeLocation *__s;
  allocator<char> local_21;
  CodeLocation *local_20;
  CodeLocation *code_location_local;
  char *name_local;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture> *this_local;
  
  local_20 = code_location;
  code_location_local = (CodeLocation *)name;
  name_local = (char *)this;
  ParameterizedTestSuiteInfoBase::ParameterizedTestSuiteInfoBase
            (&this->super_ParameterizedTestSuiteInfoBase);
  __s = code_location_local;
  (this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_003f38d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->test_suite_name_,(char *)__s,&local_21);
  std::allocator<char>::~allocator(&local_21);
  CodeLocation::CodeLocation(&this->code_location_,code_location);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::TestInfo>_>_>
  ::vector(&this->tests_);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::InstantiationInfo>_>
  ::vector(&this->instantiations_);
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(const char* name,
                                      CodeLocation code_location)
      : test_suite_name_(name), code_location_(code_location) {}